

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guarded.hpp
# Opt level: O1

guarded<std::pair<bool,_bool>,_std::mutex> * __thiscall
gmlc::libguarded::guarded<std::pair<bool,bool>,std::mutex>::operator=
          (guarded<std::pair<bool,bool>,std::mutex> *this,pair<bool,_bool> *newObj)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)(this + 8));
  if (iVar1 == 0) {
    *this = (guarded<std::pair<bool,bool>,std::mutex>)newObj->first;
    this[1] = (guarded<std::pair<bool,bool>,std::mutex>)newObj->second;
    pthread_mutex_unlock((pthread_mutex_t *)(this + 8));
    return (guarded<std::pair<bool,_bool>,_std::mutex> *)this;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

guarded& operator=(objType&& newObj)
    {  // uses a forwarding reference
        std::lock_guard<M> glock(m_mutex);
        m_obj = std::forward<objType>(newObj);
        return *this;
    }